

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcPipeSegmentType::~IfcPipeSegmentType(IfcPipeSegmentType *this)

{
  IfcPipeSegmentType *this_local;
  
  ~IfcPipeSegmentType(this);
  operator_delete(this,0x1f8);
  return;
}

Assistant:

IfcPipeSegmentType() : Object("IfcPipeSegmentType") {}